

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_M3X3(Context *ctx)

{
  size_t in_RCX;
  char row2 [64];
  char row1 [64];
  char row0 [64];
  char src0 [64];
  char code [256];
  
  make_GLSL_srcarg_string_vec3(ctx,0,src0,in_RCX);
  make_GLSL_srcarg_string_vec3(ctx,1,row0,in_RCX);
  make_GLSL_srcarg_string_vec3(ctx,2,row1,in_RCX);
  make_GLSL_srcarg_string_vec3(ctx,3,row2,in_RCX);
  make_GLSL_destarg_assign
            (ctx,code,0x100,"vec3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",src0,row0,src0,row1,src0,
             row2);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_M3X3(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
    char row0[64]; make_GLSL_srcarg_string_vec3(ctx, 1, row0, sizeof (row0));
    char row1[64]; make_GLSL_srcarg_string_vec3(ctx, 2, row1, sizeof (row1));
    char row2[64]; make_GLSL_srcarg_string_vec3(ctx, 3, row2, sizeof (row2));
    char code[256];
    make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                "vec3(dot(%s, %s), dot(%s, %s), dot(%s, %s))",
                                src0, row0, src0, row1, src0, row2);
    output_line(ctx, "%s", code);
}